

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_lex.c
# Opt level: O0

size_t yajl_string_scan(uchar *buf,size_t len,int utf8check)

{
  byte bVar1;
  bool bVar2;
  size_t skip;
  uchar mask;
  int utf8check_local;
  size_t len_local;
  uchar *buf_local;
  
  bVar1 = 0;
  if (utf8check != 0) {
    bVar1 = 0x10;
  }
  skip = 0;
  buf_local = buf;
  while( true ) {
    bVar2 = false;
    if (skip < len) {
      bVar2 = (byte)("\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
                     [*buf_local] & (bVar1 | 10)) == 0;
    }
    if (!bVar2) break;
    skip = skip + 1;
    buf_local = buf_local + 1;
  }
  return skip;
}

Assistant:

static size_t
yajl_string_scan(const unsigned char * buf, size_t len, int utf8check)
{
    unsigned char mask = IJC|NFP|(utf8check ? NUC : 0);
    size_t skip = 0;
    while (skip < len && !(charLookupTable[*buf] & mask))
    {
        skip++;
        buf++;
    }
    return skip;
}